

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::SetInnerRML(Element *this,String *rml)

{
  Releasable local_20;
  
  if (this->num_non_dom_children <
      (int)((ulong)((long)(this->children).
                          super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->children).
                         super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    do {
      RemoveChild((Element *)&stack0xffffffffffffffe0,this);
      if (local_20._vptr_Releasable != (_func_int **)0x0) {
        (**(code **)(*local_20._vptr_Releasable + 0x10))();
      }
      local_20._vptr_Releasable = (_func_int **)0x0;
    } while (this->num_non_dom_children <
             (int)((ulong)((long)(this->children).
                                 super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->children).
                                super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (rml->_M_string_length != 0) {
    Factory::InstanceElementText(this,rml);
  }
  return;
}

Assistant:

void Element::SetInnerRML(const String& rml)
{
	RMLUI_ZoneScopedC(0x6495ED);

	// Remove all DOM children.
	while ((int)children.size() > num_non_dom_children)
		RemoveChild(children.front().get());

	if (!rml.empty())
		Factory::InstanceElementText(this, rml);
}